

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::cloneDragDropEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneDragDropEvent *dest,
          QGraphicsSceneDragDropEvent *source)

{
  MouseButtons buttons;
  KeyboardModifiers modifiers;
  DropActions actions;
  DropAction DVar1;
  QWidget *pQVar2;
  QPoint QVar3;
  QMimeData *data;
  long in_FS_OFFSET;
  QPointF local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QGraphicsSceneEvent::widget(&source->super_QGraphicsSceneEvent);
  QGraphicsSceneEvent::setWidget(&dest->super_QGraphicsSceneEvent,pQVar2);
  local_30 = QGraphicsSceneDragDropEvent::pos(source);
  QGraphicsSceneDragDropEvent::setPos(dest,&local_30);
  local_30 = QGraphicsSceneDragDropEvent::scenePos(source);
  QGraphicsSceneDragDropEvent::setScenePos(dest,&local_30);
  QVar3 = QGraphicsSceneDragDropEvent::screenPos(source);
  local_30.xp = (qreal)QVar3;
  QGraphicsSceneDragDropEvent::setScreenPos(dest,(QPoint *)&local_30);
  buttons = QGraphicsSceneDragDropEvent::buttons(source);
  QGraphicsSceneDragDropEvent::setButtons(dest,buttons);
  modifiers = QGraphicsSceneDragDropEvent::modifiers(source);
  QGraphicsSceneDragDropEvent::setModifiers(dest,modifiers);
  actions = QGraphicsSceneDragDropEvent::possibleActions(source);
  QGraphicsSceneDragDropEvent::setPossibleActions(dest,actions);
  DVar1 = QGraphicsSceneDragDropEvent::proposedAction(source);
  QGraphicsSceneDragDropEvent::setProposedAction(dest,DVar1);
  DVar1 = QGraphicsSceneDragDropEvent::dropAction(source);
  QGraphicsSceneDragDropEvent::setDropAction(dest,DVar1);
  pQVar2 = QGraphicsSceneDragDropEvent::source(source);
  QGraphicsSceneDragDropEvent::setSource(dest,pQVar2);
  data = QGraphicsSceneDragDropEvent::mimeData(source);
  QGraphicsSceneDragDropEvent::setMimeData(dest,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::cloneDragDropEvent(QGraphicsSceneDragDropEvent *dest,
                                               QGraphicsSceneDragDropEvent *source)
{
    dest->setWidget(source->widget());
    dest->setPos(source->pos());
    dest->setScenePos(source->scenePos());
    dest->setScreenPos(source->screenPos());
    dest->setButtons(source->buttons());
    dest->setModifiers(source->modifiers());
    dest->setPossibleActions(source->possibleActions());
    dest->setProposedAction(source->proposedAction());
    dest->setDropAction(source->dropAction());
    dest->setSource(source->source());
    dest->setMimeData(source->mimeData());
}